

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NonConstFuncs.cpp
# Opt level: O0

Type * __thiscall
slang::ast::builtins::DistributionFunc::checkArguments
          (DistributionFunc *this,ASTContext *context,Args *args,SourceRange range,
          Expression *param_4)

{
  Expression *this_00;
  SourceRange callRange;
  Args *pAVar1;
  bool bVar2;
  reference ppEVar3;
  Type *pTVar4;
  bitmask<slang::ast::AssignFlags> local_6c;
  SourceLocation local_68;
  ulong local_60;
  size_t i;
  SourceLocation local_50;
  Compilation *local_48;
  Compilation *comp;
  Expression *param_4_local;
  Args *args_local;
  ASTContext *context_local;
  DistributionFunc *this_local;
  SourceRange range_local;
  
  range_local.startLoc = range.endLoc;
  this_local = (DistributionFunc *)range.startLoc;
  comp = (Compilation *)param_4;
  param_4_local = (Expression *)args;
  args_local = (Args *)context;
  context_local = (ASTContext *)this;
  local_48 = ASTContext::getCompilation(context);
  i = (size_t)this_local;
  local_50 = range_local.startLoc;
  callRange.endLoc = range_local.startLoc;
  callRange.startLoc = (SourceLocation)this_local;
  bVar2 = SystemSubroutine::checkArgCount
                    (&this->super_SystemSubroutine,(ASTContext *)args_local,false,
                     (Args *)param_4_local,callRange,this->numArgs,this->numArgs);
  if (bVar2) {
    for (local_60 = 0; local_60 < this->numArgs; local_60 = local_60 + 1) {
      ppEVar3 = nonstd::span_lite::span<const_slang::ast::Expression_*const,_18446744073709551615UL>
                ::operator[]((span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)
                             param_4_local,local_60);
      pTVar4 = not_null<const_slang::ast::Type_*>::operator->(&(*ppEVar3)->type);
      bVar2 = Type::isIntegral(pTVar4);
      pAVar1 = args_local;
      if (!bVar2) {
        ppEVar3 = nonstd::span_lite::
                  span<const_slang::ast::Expression_*const,_18446744073709551615UL>::operator[]
                            ((span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)
                             param_4_local,local_60);
        pTVar4 = SystemSubroutine::badArg
                           (&this->super_SystemSubroutine,(ASTContext *)pAVar1,*ppEVar3);
        return pTVar4;
      }
    }
    ppEVar3 = nonstd::span_lite::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::
              operator[]((span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)
                         param_4_local,0);
    pAVar1 = args_local;
    this_00 = *ppEVar3;
    SourceLocation::SourceLocation(&local_68);
    memset(&local_6c,0,4);
    bitmask<slang::ast::AssignFlags>::bitmask(&local_6c);
    bVar2 = Expression::requireLValue
                      (this_00,(ASTContext *)pAVar1,local_68,local_6c,(Expression *)0x0,
                       (EvalContext *)0x0);
    if (bVar2) {
      range_local.endLoc = (SourceLocation)Compilation::getIntType(local_48);
    }
    else {
      range_local.endLoc = (SourceLocation)Compilation::getErrorType(local_48);
    }
  }
  else {
    range_local.endLoc = (SourceLocation)Compilation::getErrorType(local_48);
  }
  return (Type *)range_local.endLoc;
}

Assistant:

const Type& checkArguments(const ASTContext& context, const Args& args, SourceRange range,
                               const Expression*) const final {
        auto& comp = context.getCompilation();
        if (!checkArgCount(context, false, args, range, numArgs, numArgs))
            return comp.getErrorType();

        for (size_t i = 0; i < numArgs; i++) {
            if (!args[i]->type->isIntegral())
                return badArg(context, *args[i]);
        }

        if (!args[0]->requireLValue(context))
            return comp.getErrorType();

        return comp.getIntType();
    }